

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.h
# Opt level: O2

void __thiscall
Assimp::ColladaMeshIndex::ColladaMeshIndex
          (ColladaMeshIndex *this,string *pMeshID,size_t pSubMesh,string *pMaterial)

{
  std::__cxx11::string::string((string *)this,(string *)pMeshID);
  this->mSubMesh = pSubMesh;
  std::__cxx11::string::string((string *)&this->mMaterial,(string *)pMaterial);
  return;
}

Assistant:

ColladaMeshIndex( const std::string& pMeshID, size_t pSubMesh, const std::string& pMaterial)
        : mMeshID( pMeshID), mSubMesh( pSubMesh), mMaterial( pMaterial)
    {   }